

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

CloudNode * cloudMakeNode(CloudManager *dd,CloudVar v,CloudNode *t,CloudNode *e)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  CloudManager *local_38;
  CloudNode *entryUnique;
  CloudNode *e_local;
  CloudNode *t_local;
  CloudVar v_local;
  CloudManager *dd_local;
  
  if ((t < dd->tUnique) || (dd->tUnique + dd->nNodesAlloc <= t)) {
    __assert_fail("(t) >= dd->tUnique && (t) < dd->tUnique+dd->nNodesAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0x11f,
                  "CloudNode *cloudMakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
  }
  if ((e < dd->tUnique) || (dd->tUnique + dd->nNodesAlloc <= e)) {
    __assert_fail("(e) >= dd->tUnique && (e) < dd->tUnique+dd->nNodesAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0x120,
                  "CloudNode *cloudMakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
  }
  if (((int)v < 0) || (dd->nVars <= (int)v)) {
    __assert_fail("((int)v) >= 0 && ((int)v) < dd->nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0x122,
                  "CloudNode *cloudMakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
  }
  if ((v < *(uint *)(((ulong)t & 0xfffffffffffffffe) + 4)) &&
     (v < *(uint *)(((ulong)e & 0xfffffffffffffffe) + 4))) {
    if (((ulong)t & 1) != 0) {
      __assert_fail("!Cloud_IsComplement(t)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                    ,0x124,
                    "CloudNode *cloudMakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
    }
    if ((t != (CloudNode *)0x0) && (e != (CloudNode *)0x0)) {
      uVar3 = (ulong)(((v * 0xc00005 + (int)t) * 0x40f1f9 + (int)e) * 0xb5051 >>
                     ((byte)dd->shiftUnique & 0x1f));
      local_38 = (CloudManager *)(dd->tUnique + uVar3);
      while( true ) {
        if (local_38->nVars != dd->nSignCur) {
          dd->nUniqueMisses = dd->nUniqueMisses + 1;
          iVar1 = dd->nNodesCur + 1;
          dd->nNodesCur = iVar1;
          if (iVar1 == dd->nNodesLimit) {
            printf("Cloud needs restart!\n",CONCAT44(in_register_00000034,v),uVar3);
            dd_local = (CloudManager *)0x0;
          }
          else {
            local_38->nVars = dd->nSignCur;
            local_38->bitsNode = v;
            *(CloudNode **)((long)local_38->bitsCache + 8) = t;
            *(CloudNode **)local_38->bitsCache = e;
            dd_local = local_38;
          }
          return (CloudNode *)dd_local;
        }
        if (((local_38->bitsNode == v) && (*(CloudNode **)((long)local_38->bitsCache + 8) == t)) &&
           (*(CloudNode **)local_38->bitsCache == e)) break;
        local_38 = (CloudManager *)&local_38->shiftUnique;
        lVar2 = (long)local_38 - (long)dd->tUnique;
        uVar3 = lVar2 % 0x18;
        if (lVar2 / 0x18 == (long)dd->nNodesAlloc) {
          local_38 = (CloudManager *)(dd->tUnique + 1);
        }
        dd->nUniqueSteps = dd->nUniqueSteps + 1;
      }
      dd->nUniqueHits = dd->nUniqueHits + 1;
      return (CloudNode *)local_38;
    }
    __assert_fail("t && e",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0x127,
                  "CloudNode *cloudMakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
  }
  __assert_fail("v < Cloud_V(t) && v < Cloud_V(e)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                ,0x123,
                "CloudNode *cloudMakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
}

Assistant:

CloudNode * cloudMakeNode( CloudManager * dd, CloudVar v, CloudNode * t, CloudNode * e )
{
	CloudNode * entryUnique;

	CLOUD_ASSERT(t); 
	CLOUD_ASSERT(e);

	assert( ((int)v) >= 0 && ((int)v) < dd->nVars );  // the variable must be in the range
    assert( v < Cloud_V(t) && v < Cloud_V(e) );       // variable should be above in the order
	assert( !Cloud_IsComplement(t) );                 // the THEN edge must not be complemented

	// make sure we are not searching for the constant node
	assert( t && e );

	// get the unique entry
	entryUnique = dd->tUnique + cloudHashCudd3(v, t, e, dd->shiftUnique);
	while ( entryUnique->s == dd->nSignCur )
	{
		// compare the node
		if ( entryUnique->v == v && entryUnique->t == t && entryUnique->e == e )
		{ // the node is found
			dd->nUniqueHits++;
			return entryUnique;  // returns the node
		}
		// increment the hash value modulus the hash table size
		if ( ++entryUnique - dd->tUnique == dd->nNodesAlloc )
			entryUnique = dd->tUnique + 1;
		// increment the number of steps through the table
		dd->nUniqueSteps++;
	}
	dd->nUniqueMisses++;

	// check if the new node can be created
	if ( ++dd->nNodesCur == dd->nNodesLimit ) 
	{ // initiate the restart
		printf( "Cloud needs restart!\n" );
//		fflush( stdout );
//		exit(1);
		return NULL;
	}
	// create the node
	entryUnique->s   = dd->nSignCur;
	entryUnique->v   = v;
	entryUnique->t   = t;
	entryUnique->e   = e;
	return entryUnique;  // returns the node
}